

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O0

bool __thiscall JsonModelSerialiser::fromJsonObject(JsonModelSerialiser *this,QJsonObject *source)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemModel *pQVar2;
  JsonModelSerialiserPrivate *this_00;
  JsonModelSerialiserPrivate *source_00;
  undefined4 uVar3;
  QModelIndex local_a0;
  QModelIndex local_88;
  QModelIndex local_70;
  QModelIndex local_58;
  QModelIndex local_40;
  JsonModelSerialiserPrivate *local_28;
  JsonModelSerialiserPrivate *d;
  QJsonObject *source_local;
  JsonModelSerialiser *this_local;
  
  d = (JsonModelSerialiserPrivate *)source;
  source_local = (QJsonObject *)this;
  local_28 = d_func(this);
  if ((local_28->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.m_model
      == (QAbstractItemModel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pQVar1 = (local_28->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    pQVar2 = (local_28->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    QModelIndex::QModelIndex(&local_40);
    uVar3 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_40);
    QModelIndex::QModelIndex(&local_58);
    (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar3,&local_58);
    pQVar1 = (local_28->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    pQVar2 = (local_28->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    QModelIndex::QModelIndex(&local_70);
    uVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_70);
    QModelIndex::QModelIndex(&local_88);
    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar3,&local_88);
    source_00 = d;
    this_00 = local_28;
    QModelIndex::QModelIndex(&local_a0);
    this_local._7_1_ =
         JsonModelSerialiserPrivate::fromJsonObject(this_00,(QJsonObject *)source_00,&local_a0);
  }
  return this_local._7_1_;
}

Assistant:

bool JsonModelSerialiser::fromJsonObject(const QJsonObject &source)
{
    Q_D(JsonModelSerialiser);
    if (!d->m_model)
        return false;
    d->m_model->removeColumns(0, d->m_model->columnCount());
    d->m_model->removeRows(0, d->m_model->rowCount());
    return d->fromJsonObject(source);
}